

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O3

void refresh_background_priorities(gba_ppu_t *ppu)

{
  int priority;
  int iVar1;
  
  priority = 0;
  iVar1 = 0;
  do {
    if (priority == ((ppu->BG0CNT).raw & 3)) {
      background_priorities[iVar1] = 0;
      iVar1 = iVar1 + 1;
    }
    if (priority == ((ppu->BG1CNT).raw & 3)) {
      background_priorities[iVar1] = 1;
      iVar1 = iVar1 + 1;
    }
    if (priority == ((ppu->BG2CNT).raw & 3)) {
      background_priorities[iVar1] = 2;
      iVar1 = iVar1 + 1;
    }
    if (priority == ((ppu->BG3CNT).raw & 3)) {
      background_priorities[iVar1] = 3;
      iVar1 = iVar1 + 1;
    }
    priority = priority + 1;
  } while (priority != 4);
  return;
}

Assistant:

void refresh_background_priorities(gba_ppu_t* ppu) {
    int insert_index = 0;
    // Insert all backgrounds with a certain priority, counting up
    for (int priority = 0; priority < 4; priority++) {
        if (ppu->BG0CNT.priority == priority) {
            background_priorities[insert_index] = 0;
            insert_index++;
        }
        if (ppu->BG1CNT.priority == priority) {
            background_priorities[insert_index] = 1;
            insert_index++;
        }
        if (ppu->BG2CNT.priority == priority) {
            background_priorities[insert_index] = 2;
            insert_index++;
        }
        if (ppu->BG3CNT.priority == priority) {
            background_priorities[insert_index] = 3;
            insert_index++;
        }
    }
}